

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_mbox.hpp
# Opt level: O0

void __thiscall
so_5::impl::local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::
do_deliver_service_request_to_subscriber
          (local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base> *this,
          deliver_op_tracer *tracer,subscriber_info_t *agent_info,type_index *msg_type,
          message_ref_t *message,uint overlimit_reaction_deep)

{
  anon_class_40_5_1f61f8e0 delivery_action;
  uint overlimit_reaction_deep_00;
  message_ref_t *what_to_deliver;
  message_ref_t *msg_type_00;
  subscriber_info_t *this_00;
  message_t *pmVar1;
  long *plVar2;
  agent_t *paVar3;
  control_block_t *limit;
  action_msg_tracer_t *tracer_00;
  allocator local_91;
  string local_90 [32];
  subscriber_info_t *local_70;
  type_index *ptStack_68;
  local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base> *plStack_60;
  message_ref_t *pmStack_58;
  message_ref_t *local_50;
  delivery_possibility_t local_44;
  message_t *pmStack_40;
  delivery_possibility_t delivery_status;
  message_t *svc_request_param;
  message_ref_t *pmStack_30;
  uint overlimit_reaction_deep_local;
  message_ref_t *message_local;
  type_index *msg_type_local;
  subscriber_info_t *agent_info_local;
  deliver_op_tracer *tracer_local;
  local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base> *this_local;
  
  svc_request_param._4_4_ = overlimit_reaction_deep;
  pmStack_30 = message;
  message_local = (message_ref_t *)msg_type;
  msg_type_local = (type_index *)agent_info;
  agent_info_local = (subscriber_info_t *)tracer;
  tracer_local = (deliver_op_tracer *)this;
  pmVar1 = intrusive_ptr_t<so_5::message_t>::operator*(message);
  plVar2 = (long *)__dynamic_cast(pmVar1,&message_t::typeinfo,&msg_service_request_base_t::typeinfo,
                                  0);
  if (plVar2 == (long *)0x0) {
    __cxa_bad_cast();
  }
  pmStack_40 = (message_t *)(**(code **)(*plVar2 + 0x30))();
  local_44 = local_mbox_details::subscriber_info_t::must_be_delivered
                       ((subscriber_info_t *)msg_type_local,pmStack_40);
  this_00 = agent_info_local;
  if (local_44 == must_be_delivered) {
    paVar3 = local_mbox_details::subscriber_info_t::subscriber_reference
                       ((subscriber_info_t *)msg_type_local);
    limit = local_mbox_details::subscriber_info_t::limit((subscriber_info_t *)msg_type_local);
    msg_type_00 = message_local;
    what_to_deliver = pmStack_30;
    overlimit_reaction_deep_00 = svc_request_param._4_4_;
    tracer_00 = msg_tracing_helpers::tracing_disabled_base::deliver_op_tracer::overlimit_tracer
                          ((deliver_op_tracer *)agent_info_local);
    local_70 = agent_info_local;
    ptStack_68 = msg_type_local;
    pmStack_58 = message_local;
    local_50 = pmStack_30;
    delivery_action.agent_info = (subscriber_info_t *)msg_type_local;
    delivery_action.tracer = (deliver_op_tracer *)agent_info_local;
    delivery_action.this = this;
    delivery_action.msg_type = (type_index *)message_local;
    delivery_action.message = pmStack_30;
    plStack_60 = this;
    message_limit::impl::
    try_to_deliver_to_agent<so_5::impl::local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::do_deliver_service_request_to_subscriber(so_5::impl::msg_tracing_helpers::tracing_disabled_base::deliver_op_tracer_const&,so_5::impl::local_mbox_details::subscriber_info_t_const&,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,unsigned_int)const::_lambda()_1_>
              (service_request,paVar3,limit,(type_index *)msg_type_00,what_to_deliver,
               overlimit_reaction_deep_00,tracer_00,delivery_action);
  }
  else {
    paVar3 = local_mbox_details::subscriber_info_t::subscriber_pointer
                       ((subscriber_info_t *)msg_type_local);
    msg_tracing_helpers::tracing_disabled_base::deliver_op_tracer::message_rejected
              ((deliver_op_tracer *)this_00,paVar3,local_44);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_90,
               "no service handlers (no subscribers for message or subscriber is blocked by delivery filter)"
               ,&local_91);
    exception_t::raise(0x51be03);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  return;
}

Assistant:

void
		do_deliver_service_request_to_subscriber(
			typename TRACING_BASE::deliver_op_tracer const & tracer,
			const local_mbox_details::subscriber_info_t & agent_info,
			const std::type_index & msg_type,
			const message_ref_t & message,
			unsigned int overlimit_reaction_deep ) const
			{
				auto & svc_request_param =
					dynamic_cast< msg_service_request_base_t & >( *message )
							.query_param();

				const auto delivery_status =
						agent_info.must_be_delivered( svc_request_param );

				if( delivery_possibility_t::must_be_delivered == delivery_status )
					{
						using namespace so_5::message_limit::impl;

						try_to_deliver_to_agent(
								invocation_type_t::service_request,
								agent_info.subscriber_reference(),
								agent_info.limit(),
								msg_type,
								message,
								overlimit_reaction_deep,
								tracer.overlimit_tracer(),
								[&] {
									tracer.push_to_queue( agent_info.subscriber_pointer() );

									agent_t::call_push_service_request(
											agent_info.subscriber_reference(),
											agent_info.limit(),
											m_id,
											msg_type,
											message );
								} );
					}
				else
					{
						tracer.message_rejected(
								agent_info.subscriber_pointer(),
								delivery_status );

						SO_5_THROW_EXCEPTION(
								so_5::rc_no_svc_handlers,
								"no service handlers (no subscribers for message or "
								"subscriber is blocked by delivery filter)" );
					}
			}